

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O1

void pg::freeze_thaw_reset_rec_SYNC_SLOW(WorkerP *w,Task *__dq_head)

{
  atomic<unsigned_int> *paVar1;
  Task *__dq_head_00;
  Worker *pWVar2;
  ulong uVar3;
  int iVar4;
  
  if ((w->allstolen == '\0') &&
     ((w->split <= __dq_head || (iVar4 = lace_shrink_shared(w), iVar4 == 0)))) {
    pWVar2 = w->_public;
    if (pWVar2->movesplit != '\0') {
      uVar3 = ((long)__dq_head - (long)w->split >> 6) + 1U >> 1;
      w->split = w->split + uVar3;
      LOCK();
      paVar1 = &(pWVar2->ts).ts.split;
      (paVar1->super___atomic_base<unsigned_int>)._M_i =
           (paVar1->super___atomic_base<unsigned_int>)._M_i + (int)uVar3;
      UNLOCK();
      pWVar2->movesplit = '\0';
    }
    (__dq_head->thief)._M_b._M_p = (__pointer_type)0x0;
    freeze_thaw_reset_rec_CALL
              (w,__dq_head,*(FPISolver **)__dq_head->d,*(int *)(__dq_head->d + 8),
               *(int *)(__dq_head->d + 0xc),*(int *)(__dq_head->d + 0x10));
    return;
  }
  pWVar2 = (__dq_head->thief)._M_b._M_p;
  if (pWVar2 != (Worker *)0x2) {
    while (pWVar2 < (Worker *)0x2) {
      pWVar2 = (__dq_head->thief)._M_b._M_p;
    }
    if (pWVar2 != (Worker *)0x2) {
      __dq_head_00 = __dq_head + 1;
      iVar4 = 0x20;
      do {
        pWVar2 = lace_steal(w,__dq_head_00,pWVar2);
        if (pWVar2 == (Worker *)0x2) {
          if (lace_newframe.t != (Task *)0x0) {
            lace_yield(w,__dq_head_00);
          }
          iVar4 = iVar4 + -1;
          if (iVar4 == 0) {
            lace_steal_random_CALL(w,__dq_head_00);
            iVar4 = 0x20;
          }
        }
        pWVar2 = (__dq_head->thief)._M_b._M_p;
      } while (pWVar2 != (Worker *)0x2);
    }
    if (w->allstolen == '\0') {
      w->_public->allstolen = '\x01';
      w->allstolen = '\x01';
    }
  }
  (__dq_head->thief)._M_b._M_p = (__pointer_type)0x0;
  return;
}

Assistant:

VOID_TASK_4(freeze_thaw_reset_rec, FPISolver*, solver, int, i, int, n, int, p)
{
    if (n>128) {
        // because dynamic bitset is not thread safe, work in blocks of 64...
        if (i&127) {
            // start not yet aligned
            int N = 128 - (i&127);
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            solver->freezeThawReset(i, N, p);
            SYNC(freeze_thaw_reset_rec);
        } else {
            int N = (n/128)*64;
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            CALL(freeze_thaw_reset_rec, solver, i, N, p);
            SYNC(freeze_thaw_reset_rec);
        }
    } else {
        solver->freezeThawReset(i, n, p);
    }
}